

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::SocketWriter::SocketWriter
          (SocketWriter *this,string *host,string *port)

{
  string *in_RDX;
  string *in_RSI;
  AbstractSocketWriter *in_RDI;
  SocketWriter *in_stack_00000090;
  
  AbstractSocketWriter::AbstractSocketWriter(in_RDI);
  in_RDI->_vptr_AbstractSocketWriter = (_func_int **)&PTR__SocketWriter_00965928;
  *(undefined4 *)&in_RDI[1]._vptr_AbstractSocketWriter = 0xffffffff;
  std::__cxx11::string::string((string *)(in_RDI + 2),in_RSI);
  std::__cxx11::string::string((string *)(in_RDI + 6),in_RDX);
  MakeConnection(in_stack_00000090);
  return;
}

Assistant:

SocketWriter(const std::string& host, const std::string& port)
        : sockfd_(-1), host_name_(host), port_num_(port) {
      MakeConnection();
    }